

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O1

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pcVar3;
  cmCommand *this_00;
  size_type sVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  Encoding encoding;
  uint uVar8;
  long *plVar9;
  pointer ppVar10;
  cmsysProcess *cp;
  pointer pbVar11;
  string *psVar12;
  undefined8 uVar13;
  undefined7 uVar14;
  offset_in_Arguments_to_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  in_RCX;
  ActionMap *pAVar15;
  pointer *pppVar16;
  cmMakefile *pcVar17;
  pointer __a;
  char *pcVar18;
  ulong uVar19;
  ostream *poVar20;
  vector<char,std::allocator<char>> *pvVar21;
  size_t sVar22;
  int idx;
  string_view arg;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  static_string_view name_10;
  static_string_view name_11;
  static_string_view name_12;
  static_string_view name_13;
  static_string_view name_14;
  cmProcessOutput processOutput;
  string echo_output;
  string strdata;
  int length;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  char buf [16];
  char *data;
  double timeout;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keywordsMissingValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  Arguments arguments;
  cmProcessOutput local_361;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  undefined1 local_340 [32];
  undefined4 local_320;
  int local_31c;
  vector<char,_std::allocator<char>_> local_318;
  vector<char,_std::allocator<char>_> local_2f8;
  string local_2d8;
  undefined4 local_2b0;
  uint local_2ac;
  char *local_2a8;
  double local_2a0;
  _Vector_base<char,_std::allocator<char>_> local_298;
  _Vector_base<char,_std::allocator<char>_> local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  cmCommand *local_200;
  undefined1 local_1f8 [24];
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  string local_120;
  _Alloc_hider local_100;
  size_t local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined4 local_a0;
  string local_98;
  string local_70;
  string local_50;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_360._0_8_ = (ActionMap *)0x29;
    local_1f8._0_8_ = local_1f8 + 0x10;
    local_1f8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1f8,(ulong)local_360);
    local_1f8._16_8_ = local_360._0_8_;
    builtin_strncpy((char *)local_1f8._0_8_,"called with incorrect number of arguments",0x29);
    local_1f8._8_8_ = local_360._0_8_;
    *(char *)(local_1f8._0_8_ + local_360._0_8_) = '\0';
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1f8);
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
    }
    return false;
  }
  local_200 = &this->super_cmCommand;
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar7 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar7 != 0)) {
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = 0;
    name.super_string_view._M_str = "COMMAND";
    name.super_string_view._M_len = 7;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name,in_RCX);
    name_00.super_string_view._M_str = "COMMAND_ECHO";
    name_00.super_string_view._M_len = 0xc;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_00,0x138);
    name_01.super_string_view._M_str = "OUTPUT_VARIABLE";
    name_01.super_string_view._M_len = 0xf;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_01,0x18);
    name_02.super_string_view._M_str = "ERROR_VARIABLE";
    name_02.super_string_view._M_len = 0xe;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_02,0x38);
    name_03.super_string_view._M_str = "RESULT_VARIABLE";
    name_03.super_string_view._M_len = 0xf;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_03,0x58);
    name_04.super_string_view._M_str = "RESULTS_VARIABLE";
    name_04.super_string_view._M_len = 0x10;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_04,0x78);
    name_05.super_string_view._M_str = "WORKING_DIRECTORY";
    name_05.super_string_view._M_len = 0x11;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_05,0x98);
    name_06.super_string_view._M_str = "INPUT_FILE";
    name_06.super_string_view._M_len = 10;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_06,0xb8);
    name_07.super_string_view._M_str = "OUTPUT_FILE";
    name_07.super_string_view._M_len = 0xb;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_07,0xd8);
    name_08.super_string_view._M_str = "ERROR_FILE";
    name_08.super_string_view._M_len = 10;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_08,0xf8);
    name_09.super_string_view._M_str = "TIMEOUT";
    name_09.super_string_view._M_len = 7;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_09,0x118);
    name_10.super_string_view._M_str = "OUTPUT_QUIET";
    name_10.super_string_view._M_len = 0xc;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1f8,name_10,0x158);
    name_11.super_string_view._M_str = "ERROR_QUIET";
    name_11.super_string_view._M_len = 0xb;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1f8,name_11,0x159);
    name_12.super_string_view._M_str = "OUTPUT_STRIP_TRAILING_WHITESPACE";
    name_12.super_string_view._M_len = 0x20;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1f8,name_12,0x15a);
    name_13.super_string_view._M_str = "ERROR_STRIP_TRAILING_WHITESPACE";
    name_13.super_string_view._M_len = 0x1f;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1f8,name_13,0x15b);
    name_14.super_string_view._M_str = "ENCODING";
    name_14.super_string_view._M_len = 8;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_14,0x160);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
              *)&InitialPass::parser,
             (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
              *)local_1f8);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
               *)local_1f8);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&InitialPass::parser,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1f8._16_8_ = 0;
  local_1f8._0_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_1f8._8_8_ = (pointer)0x0;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  local_160._M_p = (pointer)&local_150;
  local_158 = 0;
  local_150._M_local_buf[0] = '\0';
  local_140._M_p = (pointer)&local_130;
  local_138 = 0;
  local_130._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  local_100._M_p = (pointer)&local_f0;
  local_f8 = 0;
  local_f0._M_local_buf[0] = '\0';
  local_e0._M_p = (pointer)&local_d0;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_c0._M_p = (pointer)&local_b0;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_a0._0_1_ = false;
  local_a0._1_1_ = false;
  local_a0._2_1_ = false;
  local_a0._3_1_ = false;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_360._0_8_ = &InitialPass::parser;
  local_360._8_8_ = (string *)0x0;
  auStack_350._0_8_ = (pointer)0x0;
  auStack_350._8_8_ = auStack_350._8_8_ & 0xffffffffffffff00;
  __a = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (__a != pbVar11) {
    do {
      arg._M_str = (__a->_M_dataplus)._M_p;
      arg._M_len = __a->_M_string_length;
      ArgumentParser::Instance::Consume((Instance *)local_360,arg,local_1f8,&local_238,&local_258);
      __a = __a + 1;
    } while (__a != pbVar11);
  }
  this_00 = local_200;
  if (local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                   " called with no value for ",
                   local_258.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    plVar9 = (long *)std::__cxx11::string::append(local_340);
    local_360._0_8_ = auStack_350;
    pAVar15 = (ActionMap *)(plVar9 + 2);
    if ((ActionMap *)*plVar9 == pAVar15) {
      auStack_350._0_8_ =
           (pAVar15->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      auStack_350._8_8_ = plVar9[3];
    }
    else {
      auStack_350._0_8_ =
           (pAVar15->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_360._0_8_ = (ActionMap *)*plVar9;
    }
    local_360._8_8_ = plVar9[1];
    *plVar9 = (long)pAVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    cmCommand::SetError(this_00,(string *)local_360);
LAB_001ad794:
    if ((ActionMap *)local_360._0_8_ != (ActionMap *)auStack_350) {
      operator_delete((void *)local_360._0_8_,(ulong)(auStack_350._0_8_ + 1));
    }
    if ((ActionMap *)local_340._0_8_ != (ActionMap *)(local_340 + 0x10)) {
      ppVar10 = (pointer)CONCAT71(local_340._17_7_,local_340[0x10]);
      pAVar15 = (ActionMap *)local_340._0_8_;
LAB_001ad7be:
      operator_delete(pAVar15,(ulong)((long)&(ppVar10->first)._M_len + 1));
    }
LAB_001ad7c6:
    bVar5 = false;
    goto LAB_001ad7c8;
  }
  if (local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                   " given unknown argument \"",
                   local_238.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    plVar9 = (long *)std::__cxx11::string::append(local_340);
    local_360._0_8_ = auStack_350;
    pAVar15 = (ActionMap *)(plVar9 + 2);
    if ((ActionMap *)*plVar9 == pAVar15) {
      auStack_350._0_8_ =
           (pAVar15->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      auStack_350._8_8_ = plVar9[3];
    }
    else {
      auStack_350._0_8_ =
           (pAVar15->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_360._0_8_ = (ActionMap *)*plVar9;
    }
    local_360._8_8_ = plVar9[1];
    *plVar9 = (long)pAVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    cmCommand::SetError(this_00,(string *)local_360);
    goto LAB_001ad794;
  }
  bVar5 = cmMakefile::CanIWriteThisFile(local_200->Makefile,&local_120);
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                   "attempted to output into a file: ",&local_120);
    plVar9 = (long *)std::__cxx11::string::append(local_340);
    pAVar15 = (ActionMap *)(plVar9 + 2);
    if ((ActionMap *)*plVar9 == pAVar15) {
      auStack_350._0_8_ =
           (pAVar15->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      auStack_350._8_8_ = plVar9[3];
      local_360._0_8_ = (ActionMap *)auStack_350;
    }
    else {
      auStack_350._0_8_ =
           (pAVar15->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_360._0_8_ = (ActionMap *)*plVar9;
    }
    local_360._8_8_ = plVar9[1];
    *plVar9 = (long)pAVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    cmCommand::SetError(this_00,(string *)local_360);
    if ((ActionMap *)local_360._0_8_ != (ActionMap *)auStack_350) {
      operator_delete((void *)local_360._0_8_,(ulong)(auStack_350._0_8_ + 1));
    }
    if ((ActionMap *)local_340._0_8_ != (ActionMap *)(local_340 + 0x10)) {
      operator_delete((void *)local_340._0_8_,CONCAT71(local_340._17_7_,local_340[0x10]) + 1);
    }
    cmSystemTools::s_FatalErrorOccured = true;
    goto LAB_001ad7c6;
  }
  ppVar10 = (pointer)local_1f8._0_8_;
  if (local_1f8._0_8_ == local_1f8._8_8_) {
    local_360._0_8_ = auStack_350;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360," called with no COMMAND argument.","");
    cmCommand::SetError(this_00,(string *)local_360);
LAB_001ad952:
    ppVar10 = (pointer)auStack_350._0_8_;
    pAVar15 = (ActionMap *)local_360._0_8_;
    if ((ActionMap *)local_360._0_8_ == (ActionMap *)auStack_350) goto LAB_001ad7c6;
    goto LAB_001ad7be;
  }
  do {
    if ((((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_start ==
        (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_finish) {
      local_360._0_8_ = auStack_350;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_360," given COMMAND argument with no value.","");
      cmCommand::SetError(this_00,(string *)local_360);
      goto LAB_001ad952;
    }
    ppVar10 = (pointer)((ppVar10->second).super__Function_base._M_functor._M_pod_data + 8);
  } while (ppVar10 != (pointer)local_1f8._8_8_);
  local_2a0 = -1.0;
  if ((local_d8 != 0) && (iVar7 = __isoc99_sscanf(local_e0._M_p,"%lg",&local_2a0), iVar7 != 1)) {
    local_360._0_8_ = auStack_350;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360," called with TIMEOUT value that could not be parsed.","");
    cmCommand::SetError(this_00,(string *)local_360);
    goto LAB_001ad952;
  }
  cp = cmsysProcess_New();
  uVar13 = local_1f8._8_8_;
  if (local_1f8._0_8_ != local_1f8._8_8_) {
    __a = (pointer)local_340;
    ppVar10 = (pointer)local_1f8._0_8_;
    do {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_360,
                 ((long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_finish -
                  (long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_start >> 5) + 1,
                 (allocator_type *)__a);
      pbVar1 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_finish;
      pppVar16 = (pointer *)local_360._0_8_;
      for (pbVar11 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_start;
          pbVar11 != pbVar1; pbVar11 = pbVar11 + 1) {
        *pppVar16 = (pointer)(pbVar11->_M_dataplus)._M_p;
        pppVar16 = pppVar16 + 1;
      }
      *(undefined8 *)((long)&((string *)(local_360._8_8_ + -0x20))->field_2 + 8) = 0;
      cmsysProcess_AddCommand(cp,(char **)local_360._0_8_);
      if ((pointer *)local_360._0_8_ != (pointer *)0x0) {
        operator_delete((void *)local_360._0_8_,auStack_350._0_8_ - local_360._0_8_);
      }
      ppVar10 = (pointer)((ppVar10->second).super__Function_base._M_functor._M_pod_data + 8);
    } while (ppVar10 != (pointer)uVar13);
  }
  if (local_158 != 0) {
    cmsysProcess_SetWorkingDirectory(cp,local_160._M_p);
  }
  cmsysProcess_SetOption(cp,0,1);
  if (local_138 != 0) {
    cmsysProcess_SetPipeFile(cp,1,local_140._M_p);
  }
  if (local_120._M_string_length != 0) {
    cmsysProcess_SetPipeFile(cp,2,local_120._M_dataplus._M_p);
  }
  if (local_f8 == 0) {
LAB_001ad570:
    uVar8 = 0;
  }
  else {
    if ((local_f8 != local_120._M_string_length) ||
       (iVar7 = bcmp(local_100._M_p,local_120._M_dataplus._M_p,local_f8), iVar7 != 0)) {
      cmsysProcess_SetPipeFile(cp,3,local_100._M_p);
      goto LAB_001ad570;
    }
    uVar8 = (uint)CONCAT71((int7)((ulong)__a >> 8),1);
  }
  local_2ac = uVar8;
  if ((local_1e0._M_string_length != 0) &&
     (local_1e0._M_string_length == local_1c0._M_string_length)) {
    iVar7 = bcmp(local_1e0._M_dataplus._M_p,local_1c0._M_dataplus._M_p,local_1e0._M_string_length);
    local_2ac = 1;
    if (iVar7 != 0) {
      local_2ac = uVar8 & 0xff;
    }
  }
  if ((char)local_2ac != '\0') {
    cmsysProcess_SetOption(cp,2,1);
  }
  if (0.0 <= local_2a0) {
    cmsysProcess_SetTimeout(cp,local_2a0);
  }
  pcVar17 = this_00->Makefile;
  local_340._0_8_ = local_340 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_340,"CMAKE_EXECUTE_PROCESS_COMMAND_ECHO","");
  psVar12 = cmMakefile::GetSafeDefinition(pcVar17,(string *)local_340);
  pAVar15 = (ActionMap *)auStack_350;
  pcVar2 = (psVar12->_M_dataplus)._M_p;
  local_360._0_8_ = pAVar15;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_360,pcVar2,pcVar2 + psVar12->_M_string_length);
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,CONCAT71(local_340._17_7_,local_340[0x10]) + 1);
  }
  sVar4 = local_b8;
  if (local_b8 != 0) {
    std::__cxx11::string::_M_assign((string *)local_360);
  }
  if ((string *)local_360._8_8_ != (string *)0x0) {
    uVar13 = std::__cxx11::string::compare(local_360);
    if ((int)uVar13 == 0) {
      uVar14 = (undefined7)((ulong)uVar13 >> 8);
      bVar6 = 1;
      local_2b0 = 0;
      goto LAB_001ad974;
    }
    iVar7 = std::__cxx11::string::compare(local_360);
    if (iVar7 == 0) {
      local_2b0 = (undefined4)CONCAT71((int7)((ulong)pAVar15 >> 8),1);
      goto LAB_001ad972;
    }
    iVar7 = std::__cxx11::string::compare(local_360);
    if (iVar7 == 0) goto LAB_001ad920;
    local_340._0_8_ = local_340 + 0x10;
    local_340._8_8_ = 0;
    local_340[0x10] = '\0';
    pcVar18 = " called with \'";
    if (sVar4 == 0) {
      pcVar18 = "CMAKE_EXECUTE_PROCESS_COMMAND_ECHO set to \'";
    }
    std::__cxx11::string::operator=((string *)local_340,pcVar18);
    std::__cxx11::string::_M_append(local_340,local_360._0_8_);
    std::__cxx11::string::append(local_340);
    if (sVar4 != 0) {
      std::__cxx11::string::append(local_340);
    }
    cmMakefile::IssueMessage(this_00->Makefile,FATAL_ERROR,(string *)local_340);
    if ((ActionMap *)local_340._0_8_ != (ActionMap *)(local_340 + 0x10)) {
      uVar19 = CONCAT71(local_340._17_7_,local_340[0x10]) + 1;
      pAVar15 = (ActionMap *)local_340._0_8_;
      goto LAB_001ae13a;
    }
    goto LAB_001ae13f;
  }
LAB_001ad920:
  local_2b0 = 0;
LAB_001ad972:
  bVar6 = 0;
  uVar14 = 0;
LAB_001ad974:
  uVar13 = local_1f8._8_8_;
  bVar6 = bVar6 | (byte)local_2b0;
  if (bVar6 == 1) {
    local_320 = (undefined4)CONCAT71(uVar14,bVar6);
    local_340._0_8_ = local_340 + 0x10;
    local_340._8_8_ = 0;
    local_340[0x10] = '\0';
    if (local_1f8._0_8_ != local_1f8._8_8_) {
      ppVar10 = (pointer)local_1f8._0_8_;
      do {
        std::__cxx11::string::append(local_340);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_2d8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ppVar10,"\' \'");
        std::__cxx11::string::_M_append(local_340,(ulong)local_2d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append(local_340);
        std::__cxx11::string::append(local_340);
        ppVar10 = (pointer)((ppVar10->second).super__Function_base._M_functor._M_pod_data + 8);
      } while (ppVar10 != (pointer)uVar13);
    }
    if ((char)local_2b0 == '\0') {
      poVar20 = (ostream *)&std::cerr;
    }
    else {
      poVar20 = (ostream *)&std::cout;
    }
    if ((char)local_320 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar20,(char *)local_340._0_8_,local_340._8_8_);
    }
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,CONCAT71(local_340._17_7_,local_340[0x10]) + 1);
    }
  }
  cmsysProcess_Execute(cp);
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  encoding = cmProcessOutput::FindEncoding(&local_98);
  cmProcessOutput::cmProcessOutput(&local_361,encoding,0x400);
  local_340._0_8_ = local_340 + 0x10;
  local_340._8_8_ = 0;
  local_340[0x10] = '\0';
LAB_001adb0d:
  do {
    while( true ) {
      iVar7 = cmsysProcess_WaitForData(cp,&local_2a8,&local_31c,(double *)0x0);
      if (iVar7 != 2) break;
      if (local_a0._0_1_ == false) {
        if (local_1e0._M_string_length == 0) {
          cmProcessOutput::DecodeText(&local_361,local_2a8,(long)local_31c,(string *)local_340,1);
          cmSystemTools::Stdout((string *)local_340);
        }
        else {
          pvVar21 = (vector<char,std::allocator<char>> *)&local_2f8;
          pAVar15 = (ActionMap *)
                    local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
LAB_001adb95:
          std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>(pvVar21,pAVar15);
        }
      }
    }
    if (iVar7 == 3) {
      if (local_a0._1_1_ == false) {
        if (local_1c0._M_string_length != 0) {
          pvVar21 = (vector<char,std::allocator<char>> *)&local_318;
          pAVar15 = (ActionMap *)
                    local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          goto LAB_001adb95;
        }
        cmProcessOutput::DecodeText(&local_361,local_2a8,(long)local_31c,(string *)local_340,2);
        cmSystemTools::Stderr((string *)local_340);
      }
      goto LAB_001adb0d;
    }
  } while (iVar7 != 0);
  if ((local_a0._0_1_ == false) && (local_1e0._M_string_length == 0)) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    cmProcessOutput::DecodeText(&local_361,&local_50,(string *)local_340,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (local_340._8_8_ != 0) {
      cmSystemTools::Stdout((string *)local_340);
    }
  }
  if ((local_a0._1_1_ == false) && (local_1c0._M_string_length == 0)) {
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    cmProcessOutput::DecodeText(&local_361,&local_70,(string *)local_340,2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (local_340._8_8_ != 0) {
      cmSystemTools::Stderr((string *)local_340);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  local_278._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
            (&local_278,
             (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  pcVar3 = local_278._M_impl.super__Vector_impl_data._M_start;
  sVar22 = (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (sVar22 != 0) {
    memmove(local_278._M_impl.super__Vector_impl_data._M_start,
            local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start,sVar22);
  }
  local_278._M_impl.super__Vector_impl_data._M_finish = pcVar3 + sVar22;
  cmProcessOutput::DecodeText
            (&local_361,(vector<char,_std::allocator<char>_> *)&local_278,&local_2f8,0);
  if (local_278._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278._M_impl.super__Vector_impl_data._M_start);
  }
  local_298._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
            (&local_298,
             (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  pcVar3 = local_298._M_impl.super__Vector_impl_data._M_start;
  sVar22 = (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (sVar22 != 0) {
    memmove(local_298._M_impl.super__Vector_impl_data._M_start,
            local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start,sVar22);
  }
  local_298._M_impl.super__Vector_impl_data._M_finish = pcVar3 + sVar22;
  cmProcessOutput::DecodeText
            (&local_361,(vector<char,_std::allocator<char>_> *)&local_298,&local_318,0);
  if (local_298._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298._M_impl.super__Vector_impl_data._M_start);
  }
  cmExecuteProcessCommandFixText(&local_2f8,local_a0._2_1_);
  cmExecuteProcessCommandFixText(&local_318,local_a0._3_1_);
  if ((local_1e0._M_string_length != 0) &&
     (local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              (this_00->Makefile,&local_1e0,
               local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if ((((char)local_2ac == '\0') && (local_1c0._M_string_length != 0)) &&
     (local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              (this_00->Makefile,&local_1c0,
               local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (local_1a0._M_string_length == 0) goto switchD_001ade9b_caseD_3;
  iVar7 = cmsysProcess_GetState(cp);
  switch(iVar7) {
  case 1:
    pcVar17 = this_00->Makefile;
    pcVar18 = cmsysProcess_GetErrorString(cp);
    goto LAB_001adef8;
  case 2:
    pcVar17 = this_00->Makefile;
    pcVar18 = cmsysProcess_GetExceptionString(cp);
LAB_001adef8:
    cmMakefile::AddDefinition(pcVar17,&local_1a0,pcVar18);
    break;
  case 4:
    uVar8 = cmsysProcess_GetExitValue(cp);
    sprintf((char *)&local_2d8,"%d",(ulong)uVar8);
    cmMakefile::AddDefinition(this_00->Makefile,&local_1a0,(char *)&local_2d8);
    break;
  case 5:
    cmMakefile::AddDefinition(this_00->Makefile,&local_1a0,"Process terminated due to timeout");
  }
switchD_001ade9b_caseD_3:
  if (local_180._M_string_length == 0) goto switchD_001adf55_caseD_3;
  iVar7 = cmsysProcess_GetState(cp);
  switch(iVar7) {
  case 1:
    pcVar17 = this_00->Makefile;
    pcVar18 = cmsysProcess_GetErrorString(cp);
    goto LAB_001ae0bb;
  case 2:
    pcVar17 = this_00->Makefile;
    pcVar18 = cmsysProcess_GetExceptionString(cp);
LAB_001ae0bb:
    cmMakefile::AddDefinition(pcVar17,&local_180,pcVar18);
    break;
  case 4:
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_1f8._8_8_ != local_1f8._0_8_) {
      uVar19 = 0;
      do {
        idx = (int)uVar19;
        iVar7 = cmsysProcess_GetStateByIndex(cp,idx);
        if (iVar7 == 2) {
          local_2d8._M_dataplus._M_p = cmsysProcess_GetExceptionStringByIndex(cp,idx);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218
                     ,(char **)&local_2d8);
        }
        else if (iVar7 == 4) {
          uVar8 = cmsysProcess_GetExitValueByIndex(cp,idx);
          sprintf((char *)&local_2d8,"%d",(ulong)uVar8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218
                     ,(char (*) [16])&local_2d8);
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[36]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218
                     ,(char (*) [36])"Error getting the child return code");
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < (ulong)(((long)(local_1f8._8_8_ - local_1f8._0_8_) >> 3) *
                               -0x5555555555555555));
    }
    pcVar17 = this_00->Makefile;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_2d8,&local_218,";");
    cmMakefile::AddDefinition(pcVar17,&local_180,local_2d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
    break;
  case 5:
    cmMakefile::AddDefinition(this_00->Makefile,&local_180,"Process terminated due to timeout");
  }
switchD_001adf55_caseD_3:
  if ((ActionMap *)local_340._0_8_ != (ActionMap *)(local_340 + 0x10)) {
    operator_delete((void *)local_340._0_8_,CONCAT71(local_340._17_7_,local_340[0x10]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_361);
  if ((ActionMap *)
      local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (ActionMap *)0x0) {
    operator_delete(local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((ActionMap *)
      local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (ActionMap *)0x0) {
    uVar19 = (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    pAVar15 = (ActionMap *)
              local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
LAB_001ae13a:
    operator_delete(pAVar15,uVar19);
  }
LAB_001ae13f:
  if ((ActionMap *)local_360._0_8_ != (ActionMap *)auStack_350) {
    operator_delete((void *)local_360._0_8_,(ulong)(auStack_350._0_8_ + 1));
  }
  bVar5 = true;
  if (cp != (cmsysProcess *)0x0) {
    cmsysProcess_Delete(cp);
  }
LAB_001ad7c8:
  InitialPass::Arguments::~Arguments((Arguments *)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  return bVar5;
}

Assistant:

bool cmExecuteProcessCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  struct Arguments
  {
    std::vector<std::vector<std::string>> Commands;
    std::string OutputVariable;
    std::string ErrorVariable;
    std::string ResultVariable;
    std::string ResultsVariable;
    std::string WorkingDirectory;
    std::string InputFile;
    std::string OutputFile;
    std::string ErrorFile;
    std::string Timeout;
    std::string CommandEcho;
    bool OutputQuiet = false;
    bool ErrorQuiet = false;
    bool OutputStripTrailingWhitespace = false;
    bool ErrorStripTrailingWhitespace = false;
    std::string Encoding;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("COMMAND"_s, &Arguments::Commands)
      .Bind("COMMAND_ECHO"_s, &Arguments::CommandEcho)
      .Bind("OUTPUT_VARIABLE"_s, &Arguments::OutputVariable)
      .Bind("ERROR_VARIABLE"_s, &Arguments::ErrorVariable)
      .Bind("RESULT_VARIABLE"_s, &Arguments::ResultVariable)
      .Bind("RESULTS_VARIABLE"_s, &Arguments::ResultsVariable)
      .Bind("WORKING_DIRECTORY"_s, &Arguments::WorkingDirectory)
      .Bind("INPUT_FILE"_s, &Arguments::InputFile)
      .Bind("OUTPUT_FILE"_s, &Arguments::OutputFile)
      .Bind("ERROR_FILE"_s, &Arguments::ErrorFile)
      .Bind("TIMEOUT"_s, &Arguments::Timeout)
      .Bind("OUTPUT_QUIET"_s, &Arguments::OutputQuiet)
      .Bind("ERROR_QUIET"_s, &Arguments::ErrorQuiet)
      .Bind("OUTPUT_STRIP_TRAILING_WHITESPACE"_s,
            &Arguments::OutputStripTrailingWhitespace)
      .Bind("ERROR_STRIP_TRAILING_WHITESPACE"_s,
            &Arguments::ErrorStripTrailingWhitespace)
      .Bind("ENCODING"_s, &Arguments::Encoding);

  std::vector<std::string> unparsedArguments;
  std::vector<std::string> keywordsMissingValue;
  Arguments const arguments =
    parser.Parse(args, &unparsedArguments, &keywordsMissingValue);

  if (!keywordsMissingValue.empty()) {
    this->SetError(" called with no value for " +
                   keywordsMissingValue.front() + ".");
    return false;
  }
  if (!unparsedArguments.empty()) {
    this->SetError(" given unknown argument \"" + unparsedArguments.front() +
                   "\".");
    return false;
  }

  if (!this->Makefile->CanIWriteThisFile(arguments.OutputFile)) {
    this->SetError("attempted to output into a file: " + arguments.OutputFile +
                   " into a source directory.");
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  // Check for commands given.
  if (arguments.Commands.empty()) {
    this->SetError(" called with no COMMAND argument.");
    return false;
  }
  for (std::vector<std::string> const& cmd : arguments.Commands) {
    if (cmd.empty()) {
      this->SetError(" given COMMAND argument with no value.");
      return false;
    }
  }

  // Parse the timeout string.
  double timeout = -1;
  if (!arguments.Timeout.empty()) {
    if (sscanf(arguments.Timeout.c_str(), "%lg", &timeout) != 1) {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
    }
  }
  // Create a process instance.
  std::unique_ptr<cmsysProcess, void (*)(cmsysProcess*)> cp_ptr(
    cmsysProcess_New(), cmsysProcess_Delete);
  cmsysProcess* cp = cp_ptr.get();

  // Set the command sequence.
  for (std::vector<std::string> const& cmd : arguments.Commands) {
    std::vector<const char*> argv(cmd.size() + 1);
    std::transform(cmd.begin(), cmd.end(), argv.begin(),
                   [](std::string const& s) { return s.c_str(); });
    argv.back() = nullptr;
    cmsysProcess_AddCommand(cp, argv.data());
  }

  // Set the process working directory.
  if (!arguments.WorkingDirectory.empty()) {
    cmsysProcess_SetWorkingDirectory(cp, arguments.WorkingDirectory.c_str());
  }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if (!arguments.InputFile.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN,
                             arguments.InputFile.c_str());
  }
  if (!arguments.OutputFile.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             arguments.OutputFile.c_str());
  }
  if (!arguments.ErrorFile.empty()) {
    if (arguments.ErrorFile == arguments.OutputFile) {
      merge_output = true;
    } else {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               arguments.ErrorFile.c_str());
    }
  }
  if (!arguments.OutputVariable.empty() &&
      arguments.OutputVariable == arguments.ErrorVariable) {
    merge_output = true;
  }
  if (merge_output) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
  }

  // Set the timeout if any.
  if (timeout >= 0) {
    cmsysProcess_SetTimeout(cp, timeout);
  }

  bool echo_stdout = false;
  bool echo_stderr = false;
  bool echo_output_from_variable = true;
  std::string echo_output =
    this->Makefile->GetSafeDefinition("CMAKE_EXECUTE_PROCESS_COMMAND_ECHO");
  if (!arguments.CommandEcho.empty()) {
    echo_output_from_variable = false;
    echo_output = arguments.CommandEcho;
  }

  if (!echo_output.empty()) {
    if (echo_output == "STDERR") {
      echo_stderr = true;
    } else if (echo_output == "STDOUT") {
      echo_stdout = true;
    } else if (echo_output != "NONE") {
      std::string error;
      if (echo_output_from_variable) {
        error = "CMAKE_EXECUTE_PROCESS_COMMAND_ECHO set to '";
      } else {
        error = " called with '";
      }
      error += echo_output;
      error += "' expected STDERR|STDOUT|NONE";
      if (!echo_output_from_variable) {
        error += " for COMMAND_ECHO.";
      }
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, error);
      return true;
    }
  }
  if (echo_stdout || echo_stderr) {
    std::string command;
    for (auto& cmd : arguments.Commands) {
      command += "'";
      command += cmJoin(cmd, "' '");
      command += "'";
      command += "\n";
    }
    if (echo_stdout) {
      std::cout << command;
    } else if (echo_stderr) {
      std::cerr << command;
    }
  }
  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(
    cmProcessOutput::FindEncoding(arguments.Encoding));
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !arguments.OutputQuiet) {
      if (arguments.OutputVariable.empty()) {
        processOutput.DecodeText(data, length, strdata, 1);
        cmSystemTools::Stdout(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
      }
    } else if (p == cmsysProcess_Pipe_STDERR && !arguments.ErrorQuiet) {
      if (arguments.ErrorVariable.empty()) {
        processOutput.DecodeText(data, length, strdata, 2);
        cmSystemTools::Stderr(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempError, data, length);
      }
    }
  }
  if (!arguments.OutputQuiet && arguments.OutputVariable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }
  if (!arguments.ErrorQuiet && arguments.ErrorVariable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      cmSystemTools::Stderr(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  processOutput.DecodeText(tempError, tempError);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput,
                                 arguments.OutputStripTrailingWhitespace);
  cmExecuteProcessCommandFixText(tempError,
                                 arguments.ErrorStripTrailingWhitespace);

  // Store the output obtained.
  if (!arguments.OutputVariable.empty() && !tempOutput.empty()) {
    this->Makefile->AddDefinition(arguments.OutputVariable, tempOutput.data());
  }
  if (!merge_output && !arguments.ErrorVariable.empty() &&
      !tempError.empty()) {
    this->Makefile->AddDefinition(arguments.ErrorVariable, tempError.data());
  }

  // Store the result of running the process.
  if (!arguments.ResultVariable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[16];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(arguments.ResultVariable, buf);
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      "Process terminated due to timeout");
        break;
    }
  }
  // Store the result of running the processes.
  if (!arguments.ResultsVariable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        std::vector<std::string> res;
        for (size_t i = 0; i < arguments.Commands.size(); ++i) {
          switch (cmsysProcess_GetStateByIndex(cp, static_cast<int>(i))) {
            case kwsysProcess_StateByIndex_Exited: {
              int exitCode =
                cmsysProcess_GetExitValueByIndex(cp, static_cast<int>(i));
              char buf[16];
              sprintf(buf, "%d", exitCode);
              res.emplace_back(buf);
            } break;
            case kwsysProcess_StateByIndex_Exception:
              res.emplace_back(cmsysProcess_GetExceptionStringByIndex(
                cp, static_cast<int>(i)));
              break;
            case kwsysProcess_StateByIndex_Error:
            default:
              res.emplace_back("Error getting the child return code");
              break;
          }
        }
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmJoin(res, ";").c_str());
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      "Process terminated due to timeout");
        break;
    }
  }

  return true;
}